

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall
optimization::graph_color::Graph_Color::init_conflict_map
          (Graph_Color *this,shared_ptr<optimization::livevar_analyse::Block_Live_Var> *blv,
          shared_ptr<optimization::graph_color::Conflict_Map> *conflict_map,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *cross_blk_vars)

{
  bool bVar1;
  int iVar2;
  TyKind TVar3;
  element_type *peVar4;
  pointer pIVar5;
  _Rb_tree_const_iterator<mir::inst::VarId> __first2;
  size_type sVar6;
  size_type sVar7;
  difference_type dVar8;
  undefined8 in_RCX;
  _Rb_tree_const_iterator<mir::inst::VarId> in_RSI;
  insert_iterator<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  iVar9;
  insert_iterator<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  iVar10;
  VarId var;
  iterator __end2;
  iterator __begin2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  cross_use_vars;
  int idx;
  VarId defVar;
  iterator iter;
  BasicBlk *block;
  VarId *in_stack_fffffffffffffde8;
  iterator in_stack_fffffffffffffdf0;
  VarId *in_stack_fffffffffffffdf8;
  Block_Live_Var *in_stack_fffffffffffffe00;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *psVar11;
  _Rb_tree_const_iterator<mir::inst::VarId> __first1;
  _Self local_148;
  _Self local_140;
  undefined8 local_138;
  insert_iterator<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  local_f0;
  _Base_ptr local_d0;
  insert_iterator<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  local_c8;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *in_stack_ffffffffffffff70;
  _Base_ptr in_stack_ffffffffffffff78;
  Conflict_Map *in_stack_ffffffffffffff80;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_30;
  BasicBlk *local_28;
  undefined8 local_20;
  
  __first1._M_node = in_RSI._M_node;
  local_20 = in_RCX;
  peVar4 = std::
           __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a96fe);
  local_28 = peVar4->block;
  local_30._M_current =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
       std::
       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                *)in_stack_fffffffffffffde8);
  do {
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *)in_stack_fffffffffffffde8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)in_stack_fffffffffffffdf0._M_node,
                       (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)in_stack_fffffffffffffde8);
    if (!bVar1) {
      local_138 = local_20;
      local_140._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffffde8);
      local_148._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffde8);
      while( true ) {
        bVar1 = std::operator!=(&local_140,&local_148);
        if (!bVar1) break;
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1a9ade);
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffffdf0._M_node,in_stack_fffffffffffffde8);
        std::
        __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a9afb);
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffffdf0._M_node,in_stack_fffffffffffffde8);
        bVar1 = Conflict_Map::has_var
                          ((Conflict_Map *)in_stack_fffffffffffffdf0._M_node,
                           in_stack_fffffffffffffde8);
        if (!bVar1) {
          in_stack_fffffffffffffdf0._M_node =
               (_Base_ptr)
               std::
               __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a9b3c);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffffdf0._M_node,in_stack_fffffffffffffde8);
          std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                 *)0x1a9b82);
          Conflict_Map::add_conflict
                    (in_stack_ffffffffffffff80,(VarId *)in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff70);
          std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)0x1a9ba2);
        }
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffffdf0._M_node);
      }
      return;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator->(&local_30);
    pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        in_stack_fffffffffffffdf0._M_node);
    iVar2 = (*(pIVar5->super_Displayable)._vptr_Displayable[1])();
    if (iVar2 != 7) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator->(&local_30);
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffffdf0._M_node);
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffdf0._M_node,in_stack_fffffffffffffde8);
      __first2._M_node =
           (_Base_ptr)
           std::
           __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a97b8);
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffdf0._M_node,in_stack_fffffffffffffde8);
      TVar3 = livevar_analyse::Block_Live_Var::queryTy
                        (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if (TVar3 != Void) {
        sVar6 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        if (sVar6 == 0) {
          std::
          __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a9811);
          sVar7 = std::
                  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                           *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
          if (sVar7 == 0) goto LAB_001a9a1e;
        }
        std::
        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 *)in_stack_fffffffffffffde8);
        dVar8 = __gnu_cxx::operator-
                          ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                            *)in_stack_fffffffffffffdf0._M_node,
                           (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                            *)in_stack_fffffffffffffde8);
        psVar11 = (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)&stack0xffffffffffffff68;
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )0x1a9877);
        peVar4 = std::
                 __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a9881);
        std::
        vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::operator[](&peVar4->instLiveVars,(long)(int)dVar8);
        std::
        __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a9899);
        local_a0 = (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)in_stack_fffffffffffffde8);
        peVar4 = std::
                 __shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a98b3);
        std::
        vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::operator[](&peVar4->instLiveVars,(long)(int)dVar8);
        std::
        __shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a98cb);
        local_a8 = (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_fffffffffffffde8);
        local_b0 = (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)in_stack_fffffffffffffde8);
        local_b8 = (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_fffffffffffffde8);
        local_d0 = (_Base_ptr)
                   std::
                   set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)in_stack_fffffffffffffde8);
        iVar9 = std::
                inserter<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>
                          ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            *)in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
        iVar10.iter._M_node = iVar9.iter._M_node._M_node;
        iVar10.container = psVar11;
        local_c8 = iVar9;
        iVar10 = std::
                 set_intersection<std::_Rb_tree_const_iterator<mir::inst::VarId>,std::_Rb_tree_const_iterator<mir::inst::VarId>,std::insert_iterator<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>
                           (__first1,in_RSI,__first2,(_Base_ptr)iVar9.container,iVar10);
        local_f0 = iVar10;
        std::
        __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a99b7);
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffffdf0._M_node,in_stack_fffffffffffffde8);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )in_stack_fffffffffffffdf0._M_node,
            (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )in_stack_fffffffffffffde8);
        Conflict_Map::add_conflict
                  (in_stack_ffffffffffffff80,(VarId *)in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1a9a11);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1a9a1e);
      }
    }
LAB_001a9a1e:
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

void init_conflict_map(std::shared_ptr<livevar_analyse::Block_Live_Var> blv,
                         std::shared_ptr<Conflict_Map>& conflict_map,
                         std::set<mir::inst::VarId>& cross_blk_vars) {
    auto& block = blv->block;
    for (auto iter = block.inst.begin(); iter != block.inst.end(); ++iter) {
      if (iter->get()->inst_kind() == mir::inst::InstKind::Phi) {
        continue;
      }
      auto defVar = iter->get()->dest;
      if (blv->queryTy(defVar) == mir::types::TyKind::Void ||
          !cross_blk_vars.count(defVar) &&
              !conflict_map->merged_var_Map.count(defVar)) {
        continue;
      }
      int idx = iter - block.inst.begin();
      std::set<mir::inst::VarId> cross_use_vars;
      std::set_intersection(
          blv->instLiveVars[idx]->begin(), blv->instLiveVars[idx]->end(),
          cross_blk_vars.begin(), cross_blk_vars.end(),
          std::inserter(cross_use_vars, cross_use_vars.begin()));
      conflict_map->add_conflict(defVar, cross_use_vars);
    }
    for (auto var : cross_blk_vars) {
      if (!conflict_map->has_var(var)) {
        conflict_map->add_conflict(var, std::set<mir::inst::VarId>());
      }
    }
    // LOG(TRACE) << "conflict map : " << std::endl;
    // for (auto pair : conflict_map->dynamic_Map) {
    //   LOG(TRACE) << pair.first << " : ";
    //   for (auto var : pair.second) {
    //     LOG(TRACE) << var << ", ";
    //   }
    //   LOG(TRACE) << std::endl;
    // }
  }